

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O0

int32_t dtl_json_dump(dtl_dv_t *dv,FILE *fh,int32_t indent,_Bool sortKeys)

{
  undefined1 local_58 [8];
  dtl_json_writer_t writer;
  _Bool sortKeys_local;
  int32_t indent_local;
  FILE *fh_local;
  dtl_dv_t *dv_local;
  
  writer._51_1_ = sortKeys;
  writer._52_4_ = indent;
  dtl_json_writer_createWithFile((dtl_json_writer_t *)local_58,fh);
  if (0 < (int)writer._52_4_) {
    dtl_json_writer_setIndentWidth((dtl_json_writer_t *)local_58,writer._52_4_);
  }
  if ((writer._51_1_ & 1) != 0) {
    dtl_json_writer_setSortKeys((dtl_json_writer_t *)local_58,true);
  }
  dtl_json_writer_write_dv((dtl_json_writer_t *)local_58,dv,true);
  dtl_json_writer_destroy((dtl_json_writer_t *)local_58,false);
  return 0;
}

Assistant:

int32_t dtl_json_dump(const dtl_dv_t *dv, FILE *fh, int32_t indent, bool sortKeys)
{
   dtl_json_writer_t writer;
   dtl_json_writer_createWithFile(&writer, fh);
   if (indent > 0)
   {
      dtl_json_writer_setIndentWidth(&writer, indent);
   }
   if (sortKeys)
   {
      dtl_json_writer_setSortKeys(&writer, true);
   }
   dtl_json_writer_write_dv(&writer, dv, true);
   dtl_json_writer_destroy(&writer, false);
   return 0;
}